

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O0

void nghttp2_stream_change_weight(nghttp2_stream *stream,int32_t weight)

{
  uint uVar1;
  nghttp2_stream *pnVar2;
  ulong uVar3;
  uint64_t wlen_penalty;
  int32_t old_weight;
  uint64_t last_cycle;
  nghttp2_stream *dep_stream;
  int32_t weight_local;
  nghttp2_stream *stream_local;
  
  if (stream->weight != weight) {
    uVar1 = stream->weight;
    stream->weight = weight;
    pnVar2 = stream->dep_prev;
    if ((pnVar2 != (nghttp2_stream *)0x0) &&
       (pnVar2->sum_dep_weight = (weight - uVar1) + pnVar2->sum_dep_weight, stream->queued != '\0'))
    {
      nghttp2_pq_remove(&pnVar2->obq,&stream->pq_entry);
      uVar3 = stream->last_writelen * 0x100;
      stream->pending_penalty =
           (uint32_t)
           (((ulong)(stream->pending_penalty + uVar1) - uVar3 % (ulong)uVar1) % (ulong)uVar1);
      stream_next_cycle(stream,stream->cycle - (uVar3 + stream->pending_penalty) / (ulong)uVar1);
      if (pnVar2->descendant_last_cycle - stream->cycle < 0x100000000) {
        stream->cycle = pnVar2->descendant_last_cycle;
      }
      nghttp2_pq_push(&pnVar2->obq,&stream->pq_entry);
    }
  }
  return;
}

Assistant:

void nghttp2_stream_change_weight(nghttp2_stream *stream, int32_t weight) {
  nghttp2_stream *dep_stream;
  uint64_t last_cycle;
  int32_t old_weight;
  uint64_t wlen_penalty;

  if (stream->weight == weight) {
    return;
  }

  old_weight = stream->weight;
  stream->weight = weight;

  dep_stream = stream->dep_prev;

  if (!dep_stream) {
    return;
  }

  dep_stream->sum_dep_weight += weight - old_weight;

  if (!stream->queued) {
    return;
  }

  nghttp2_pq_remove(&dep_stream->obq, &stream->pq_entry);

  wlen_penalty = (uint64_t)stream->last_writelen * NGHTTP2_MAX_WEIGHT;

  /* Compute old stream->pending_penalty we used to calculate
     stream->cycle */
  stream->pending_penalty =
      (uint32_t)((stream->pending_penalty + (uint32_t)old_weight -
                  (wlen_penalty % (uint32_t)old_weight)) %
                 (uint32_t)old_weight);

  last_cycle = stream->cycle -
               (wlen_penalty + stream->pending_penalty) / (uint32_t)old_weight;

  /* Now we have old stream->pending_penalty and new stream->weight in
     place */
  stream_next_cycle(stream, last_cycle);

  if (dep_stream->descendant_last_cycle - stream->cycle <=
      NGHTTP2_MAX_CYCLE_DISTANCE) {
    stream->cycle = dep_stream->descendant_last_cycle;
  }

  /* Continue to use same stream->seq */

  nghttp2_pq_push(&dep_stream->obq, &stream->pq_entry);

  DEBUGF("stream: stream=%d obq resched cycle=%lu\n", stream->stream_id,
         stream->cycle);
}